

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O1

Aig_Obj_t * Aig_And(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  bool bVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *extraout_RDX;
  Aig_Obj_t *p1_00;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  
  if (p0 == p1) {
    return p0;
  }
  pAVar5 = (Aig_Obj_t *)((ulong)p1 ^ 1);
  if (pAVar5 == p0) {
    return (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
  }
  pAVar10 = (Aig_Obj_t *)((ulong)p0 & 0xfffffffffffffffe);
  pAVar9 = p->pConst1;
  if (pAVar9 == pAVar10) {
    if (pAVar9 == p0) {
      return p1;
    }
LAB_00601ec9:
    return (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
  }
  pAVar11 = (Aig_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
  if (pAVar9 == pAVar11) {
    if (pAVar9 == p1) {
      return p0;
    }
    goto LAB_00601ec9;
  }
  p1_00 = p1;
  pAVar6 = p0;
  if ((p->fAddStrash == 0) ||
     (((*(uint *)&pAVar10->field_0x18 & 7) - 7 < 0xfffffffe &&
      ((*(uint *)&pAVar11->field_0x18 & 7) - 7 < 0xfffffffe)))) goto LAB_0060217d;
  pAVar1 = pAVar10->pFanin0;
  p1_00 = pAVar10->pFanin1;
  pAVar2 = pAVar11->pFanin0;
  pAVar3 = pAVar11->pFanin1;
  pAVar7 = p0;
  if (((ulong)p0 & 1) != 0) {
    if (p1_00 != pAVar5 && pAVar1 != pAVar5) {
      if (p1_00 == p1) {
        pAVar5 = p1_00;
        pAVar9 = (Aig_Obj_t *)((ulong)pAVar1 ^ 1);
      }
      else {
        if (pAVar1 != p1) goto LAB_00601f15;
        pAVar5 = pAVar1;
        pAVar9 = (Aig_Obj_t *)((ulong)p1_00 ^ 1);
      }
      goto LAB_0060216d;
    }
    goto LAB_00601e93;
  }
  if (p1_00 == pAVar5 || pAVar1 == pAVar5) goto LAB_00601ed9;
  if (p1_00 == p1 || pAVar1 == p1) {
LAB_00601f54:
    pAVar6 = (Aig_Obj_t *)0x0;
  }
  else {
LAB_00601f15:
    pAVar6 = (Aig_Obj_t *)((ulong)p0 ^ 1);
    pAVar5 = pAVar3;
    if (((ulong)p1 & 1) != 0) {
      if (pAVar3 != pAVar6 && pAVar2 != pAVar6) {
        if (pAVar3 == p0) {
          pAVar9 = (Aig_Obj_t *)((ulong)pAVar2 ^ 1);
        }
        else {
          if (pAVar2 != p0) goto LAB_00601f7d;
          pAVar5 = pAVar2;
          pAVar9 = (Aig_Obj_t *)((ulong)pAVar3 ^ 1);
        }
LAB_0060216d:
        pAVar7 = Aig_And(p,pAVar9,pAVar5);
        pAVar6 = (Aig_Obj_t *)0x0;
        p1_00 = extraout_RDX;
        goto LAB_00602174;
      }
      goto LAB_00601f54;
    }
    if (pAVar3 != pAVar6 && pAVar2 != pAVar6) {
      if (pAVar3 == p0 || pAVar2 == p0) goto LAB_00601e93;
LAB_00601f7d:
      if ((((uint)p1 | (uint)p0) & 1) == 0) {
        pAVar7 = (Aig_Obj_t *)((ulong)pAVar2 ^ 1);
        if ((((pAVar1 == pAVar7) || (pAVar8 = (Aig_Obj_t *)((ulong)pAVar3 ^ 1), pAVar1 == pAVar8))
            || (p1_00 == pAVar7)) || (p1_00 == pAVar8)) goto LAB_00601ed9;
        pAVar9 = p0;
        if (((pAVar1 == pAVar2) || (p1_00 == pAVar2)) ||
           ((pAVar5 = p1, pAVar9 = pAVar1, p1_00 == pAVar3 ||
            (pAVar5 = pAVar2, pAVar9 = p0, pAVar1 == pAVar3)))) goto LAB_0060216d;
LAB_006020fc:
        pAVar6 = (Aig_Obj_t *)CONCAT71((int7)((ulong)pAVar8 >> 8),1);
      }
      else if (((ulong)p0 & 1) == 0 || ((ulong)p1 & 1) != 0) {
        if (((ulong)p1 & 1) != 0 && ((ulong)p0 & 1) == 0) {
          if (pAVar2 != (Aig_Obj_t *)((ulong)pAVar1 ^ 1)) {
            pAVar8 = (Aig_Obj_t *)0x0;
            pAVar6 = (Aig_Obj_t *)0x0;
            if ((pAVar2 != (Aig_Obj_t *)((ulong)p1_00 ^ 1)) &&
               (pAVar3 != (Aig_Obj_t *)((ulong)pAVar1 ^ 1))) {
              if (pAVar3 != (Aig_Obj_t *)((ulong)p1_00 ^ 1)) {
                pAVar9 = pAVar2;
                if ((((pAVar3 != pAVar1) && (pAVar3 != p1_00)) &&
                    (pAVar9 = pAVar3, pAVar2 != pAVar1)) && (pAVar2 != p1_00)) goto LAB_006020fc;
                pAVar5 = p0;
                pAVar9 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
                goto LAB_0060216d;
              }
              goto LAB_00602174;
            }
          }
          goto LAB_00601f54;
        }
        if ((pAVar1 == pAVar3) && (p1_00 == (Aig_Obj_t *)((ulong)pAVar2 ^ 1))) {
LAB_006020a3:
          pAVar7 = (Aig_Obj_t *)((ulong)pAVar1 ^ 1);
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)pAVar3 ^ 1);
          if ((p1_00 != pAVar2) || (pAVar1 != pAVar7)) {
            if ((pAVar1 == pAVar2) && (p1_00 == pAVar7)) goto LAB_006020a3;
            pAVar6 = (Aig_Obj_t *)CONCAT71((int7)((ulong)p0 >> 8),1);
            if ((p1_00 != pAVar3) || (pAVar1 != (Aig_Obj_t *)((ulong)pAVar2 ^ 1)))
            goto LAB_00602174;
          }
          pAVar7 = (Aig_Obj_t *)((ulong)p1_00 ^ 1);
          pAVar6 = (Aig_Obj_t *)0x0;
          p1_00 = pAVar7;
        }
      }
      else {
        if (pAVar1 != (Aig_Obj_t *)((ulong)pAVar2 ^ 1)) {
          pAVar6 = (Aig_Obj_t *)0x0;
          if ((pAVar1 != (Aig_Obj_t *)((ulong)pAVar3 ^ 1)) &&
             (p1_00 != (Aig_Obj_t *)((ulong)pAVar2 ^ 1))) {
            pAVar7 = p1;
            if (p1_00 != (Aig_Obj_t *)((ulong)pAVar3 ^ 1)) {
              if ((p1_00 == pAVar2) || (p1_00 == pAVar3)) {
                pAVar9 = (Aig_Obj_t *)((ulong)pAVar1 ^ 1);
                pAVar5 = p1;
              }
              else {
                if ((pAVar1 != pAVar2) && (pAVar8 = pAVar6, pAVar1 != pAVar3)) goto LAB_006020fc;
                pAVar5 = p1;
                pAVar9 = (Aig_Obj_t *)((ulong)p1_00 ^ 1);
              }
              goto LAB_0060216d;
            }
            goto LAB_00602174;
          }
        }
LAB_00601e93:
        pAVar6 = (Aig_Obj_t *)0x0;
        pAVar7 = p1;
      }
    }
    else {
LAB_00601ed9:
      pAVar6 = (Aig_Obj_t *)0x0;
      pAVar7 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
    }
  }
LAB_00602174:
  if ((char)pAVar6 == '\0') {
    return pAVar7;
  }
LAB_0060217d:
  if (p->fCatchExor != 0) {
    bVar4 = true;
    if (((((uint)p0 & (uint)p1 & 1) != 0) && ((*(uint *)&pAVar10->field_0x18 & 7) == 5)) &&
       ((*(uint *)&pAVar11->field_0x18 & 7) == 5)) {
      pAVar6 = pAVar10->pFanin0;
      p1_00 = (Aig_Obj_t *)((ulong)pAVar11->pFanin0 ^ (ulong)pAVar6);
      if (((p1_00 < (Aig_Obj_t *)0x2) && (pAVar11->pFanin0 != pAVar6)) &&
         (p1_00 = pAVar10->pFanin1, ((ulong)pAVar11->pFanin1 ^ (ulong)p1_00) == 1)) {
        bVar4 = false;
      }
    }
    if (!bVar4) {
      pAVar5 = Aig_Exor(p,pAVar6,p1_00);
      return pAVar5;
    }
  }
  if ((*(uint *)&pAVar10->field_0x18 & 7) == 1) {
    __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x15d,
                  "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                 );
  }
  if ((p1 != (Aig_Obj_t *)0x0) && ((*(uint *)&pAVar11->field_0x18 & 7) == 1)) {
    __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x15e,
                  "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                 );
  }
  if (pAVar10 == pAVar11) {
    __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x15f,
                  "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                 );
  }
  *(ulong *)&(p->Ghost).field_0x18 = *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
  pAVar5 = p1;
  if ((p1 != (Aig_Obj_t *)0x0) && (pAVar11->Id <= pAVar10->Id)) {
    pAVar5 = p0;
    p0 = p1;
  }
  (p->Ghost).pFanin0 = p0;
  (p->Ghost).pFanin1 = pAVar5;
  pAVar5 = Aig_TableLookup(p,&p->Ghost);
  if (pAVar5 != (Aig_Obj_t *)0x0) {
    return pAVar5;
  }
  pAVar5 = Aig_ObjCreate(p,&p->Ghost);
  return pAVar5;
}

Assistant:

Aig_Obj_t * Aig_And( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    Aig_Obj_t * pGhost, * pResult;
    Aig_Obj_t * pFan0, * pFan1;
    // check trivial cases
    if ( p0 == p1 )
        return p0;
    if ( p0 == Aig_Not(p1) )
        return Aig_Not(p->pConst1);
    if ( Aig_Regular(p0) == p->pConst1 )
        return p0 == p->pConst1 ? p1 : Aig_Not(p->pConst1);
    if ( Aig_Regular(p1) == p->pConst1 )
        return p1 == p->pConst1 ? p0 : Aig_Not(p->pConst1);
    // check not so trivial cases
    if ( p->fAddStrash && (Aig_ObjIsNode(Aig_Regular(p0)) || Aig_ObjIsNode(Aig_Regular(p1))) )
    { // http://fmv.jku.at/papers/BrummayerBiere-MEMICS06.pdf
        Aig_Obj_t * pFanA, * pFanB, * pFanC, * pFanD;
        pFanA = Aig_ObjChild0(Aig_Regular(p0));
        pFanB = Aig_ObjChild1(Aig_Regular(p0));
        pFanC = Aig_ObjChild0(Aig_Regular(p1));
        pFanD = Aig_ObjChild1(Aig_Regular(p1));
        if ( Aig_IsComplement(p0) )
        {
            if ( pFanA == Aig_Not(p1) || pFanB == Aig_Not(p1) )
                return p1;
            if ( pFanB == p1 )
                return Aig_And( p, Aig_Not(pFanA), pFanB );
            if ( pFanA == p1 )
                return Aig_And( p, Aig_Not(pFanB), pFanA );
        }
        else
        {
            if ( pFanA == Aig_Not(p1) || pFanB == Aig_Not(p1) )
                return Aig_Not(p->pConst1);
            if ( pFanA == p1 || pFanB == p1 )
                return p0;
        }
        if ( Aig_IsComplement(p1) )
        {
            if ( pFanC == Aig_Not(p0) || pFanD == Aig_Not(p0) )
                return p0;
            if ( pFanD == p0 )
                return Aig_And( p, Aig_Not(pFanC), pFanD );
            if ( pFanC == p0 )
                return Aig_And( p, Aig_Not(pFanD), pFanC );
        }
        else
        {
            if ( pFanC == Aig_Not(p0) || pFanD == Aig_Not(p0) )
                return Aig_Not(p->pConst1);
            if ( pFanC == p0 || pFanD == p0 )
                return p1;
        }
        if ( !Aig_IsComplement(p0) && !Aig_IsComplement(p1) ) 
        {
            if ( pFanA == Aig_Not(pFanC) || pFanA == Aig_Not(pFanD) || pFanB == Aig_Not(pFanC) || pFanB == Aig_Not(pFanD) )
                return Aig_Not(p->pConst1);
            if ( pFanA == pFanC || pFanB == pFanC )
                return Aig_And( p, p0, pFanD );
            if ( pFanB == pFanC || pFanB == pFanD )
                return Aig_And( p, pFanA, p1 );
            if ( pFanA == pFanD || pFanB == pFanD )
                return Aig_And( p, p0, pFanC );
            if ( pFanA == pFanC || pFanA == pFanD )
                return Aig_And( p, pFanB, p1 );
        }
        else if ( Aig_IsComplement(p0) && !Aig_IsComplement(p1) )
        {
            if ( pFanA == Aig_Not(pFanC) || pFanA == Aig_Not(pFanD) || pFanB == Aig_Not(pFanC) || pFanB == Aig_Not(pFanD) )
                return p1;
            if ( pFanB == pFanC || pFanB == pFanD )
                return Aig_And( p, Aig_Not(pFanA), p1 );
            if ( pFanA == pFanC || pFanA == pFanD )
                return Aig_And( p, Aig_Not(pFanB), p1 );
        }
        else if ( !Aig_IsComplement(p0) && Aig_IsComplement(p1) )
        {
            if ( pFanC == Aig_Not(pFanA) || pFanC == Aig_Not(pFanB) || pFanD == Aig_Not(pFanA) || pFanD == Aig_Not(pFanB) )
                return p0;
            if ( pFanD == pFanA || pFanD == pFanB )
                return Aig_And( p, Aig_Not(pFanC), p0 );
            if ( pFanC == pFanA || pFanC == pFanB )
                return Aig_And( p, Aig_Not(pFanD), p0 );
        }
        else // if ( Aig_IsComplement(p0) && Aig_IsComplement(p1) )
        {
            if ( pFanA == pFanD && pFanB == Aig_Not(pFanC) )
                return Aig_Not(pFanA);
            if ( pFanB == pFanC && pFanA == Aig_Not(pFanD) )
                return Aig_Not(pFanB);
            if ( pFanA == pFanC && pFanB == Aig_Not(pFanD) )
                return Aig_Not(pFanA);
            if ( pFanB == pFanD && pFanA == Aig_Not(pFanC) )
                return Aig_Not(pFanB);
        }
    }
    // check if it can be an EXOR gate
    if ( p->fCatchExor && Aig_ObjIsExorType( p0, p1, &pFan0, &pFan1 ) )
        return Aig_Exor( p, pFan0, pFan1 );
    pGhost = Aig_ObjCreateGhost( p, p0, p1, AIG_OBJ_AND );
    if ( (pResult = Aig_TableLookup( p, pGhost )) )
        return pResult;
    return Aig_ObjCreate( p, pGhost );
}